

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void VP8LTransformColorInverse_C(VP8LMultipliers *m,uint32_t *src,int num_pixels,uint32_t *dst)

{
  uint uVar1;
  int8_t color;
  int iVar2;
  uint uVar3;
  int iVar4;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int8_t *in_RDI;
  int new_blue;
  int new_red;
  uint32_t red;
  int8_t green;
  uint32_t argb;
  int i;
  int local_24;
  
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    uVar1 = *(uint *)(in_RSI + (long)local_24 * 4);
    color = (int8_t)(uVar1 >> 8);
    iVar2 = ColorTransformDelta(*in_RDI,color);
    uVar3 = iVar2 + (uVar1 >> 0x10 & 0xff);
    iVar2 = ColorTransformDelta(in_RDI[1],color);
    iVar4 = ColorTransformDelta(in_RDI[2],(int8_t)uVar3);
    *(uint *)(in_RCX + (long)local_24 * 4) =
         uVar1 & 0xff00ff00 | (uVar3 & 0xff) << 0x10 | iVar4 + iVar2 + (uVar1 & 0xff) & 0xff;
  }
  return;
}

Assistant:

void VP8LTransformColorInverse_C(const VP8LMultipliers* const m,
                                 const uint32_t* src, int num_pixels,
                                 uint32_t* dst) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = src[i];
    const int8_t green = (int8_t)(argb >> 8);
    const uint32_t red = argb >> 16;
    int new_red = red & 0xff;
    int new_blue = argb & 0xff;
    new_red += ColorTransformDelta((int8_t)m->green_to_red, green);
    new_red &= 0xff;
    new_blue += ColorTransformDelta((int8_t)m->green_to_blue, green);
    new_blue += ColorTransformDelta((int8_t)m->red_to_blue, (int8_t)new_red);
    new_blue &= 0xff;
    dst[i] = (argb & 0xff00ff00u) | (new_red << 16) | (new_blue);
  }
}